

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O2

void __thiscall
OptionRecordDouble::OptionRecordDouble
          (OptionRecordDouble *this,string *Xname,string *Xdescription,bool Xadvanced,
          double *Xvalue_pointer,double Xlower_bound,double Xdefault_value,double Xupper_bound)

{
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)Xname);
  std::__cxx11::string::string((string *)&local_60,(string *)Xdescription);
  OptionRecord::OptionRecord(&this->super_OptionRecord,kDouble,&local_40,&local_60,Xadvanced);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_OptionRecord)._vptr_OptionRecord = (_func_int **)&PTR__OptionRecord_00432d08;
  this->value = Xvalue_pointer;
  this->lower_bound = Xlower_bound;
  this->default_value = Xdefault_value;
  this->upper_bound = Xupper_bound;
  *Xvalue_pointer = Xdefault_value;
  return;
}

Assistant:

OptionRecordDouble(std::string Xname, std::string Xdescription,
                     bool Xadvanced, double* Xvalue_pointer,
                     double Xlower_bound, double Xdefault_value,
                     double Xupper_bound)
      : OptionRecord(HighsOptionType::kDouble, Xname, Xdescription, Xadvanced) {
    value = Xvalue_pointer;
    lower_bound = Xlower_bound;
    default_value = Xdefault_value;
    upper_bound = Xupper_bound;
    *value = default_value;
  }